

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-multi-accept.c
# Opt level: O2

int test_tcp(uint num_servers,uint num_clients)

{
  ulong __nmemb;
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  void *__ptr;
  uv_tcp_t *__ptr_00;
  uv_loop_t *loop;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  uint *puVar8;
  uv_tcp_t *tcp;
  char *pcVar9;
  void *arg;
  uv_sem_t *puVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  double dVar13;
  uv_tcp_t local_248;
  uint local_140;
  uv_pipe_t local_138;
  
  __nmemb = (ulong)num_servers;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&listen_addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    __ptr = calloc(__nmemb,0x1b8);
    __ptr_00 = (uv_tcp_t *)calloc(0x28,0x1e8);
    if (__ptr == (void *)0x0) {
      pcVar9 = "servers";
      uVar5 = 0x177;
    }
    else {
      if (__ptr_00 != (uv_tcp_t *)0x0) {
        lVar6 = __nmemb + 1;
        arg = __ptr;
        while (lVar6 = lVar6 + -1, lVar6 != 0) {
          iVar1 = uv_sem_init((uv_sem_t *)((long)arg + 0x198),0);
          if (iVar1 != 0) {
            pcVar9 = "0 == uv_sem_init(&ctx->semaphore, 0)";
            uVar5 = 0x180;
            goto LAB_00108493;
          }
          iVar1 = uv_thread_create((uv_thread_t *)((long)arg + 400),server_cb,arg);
          arg = (void *)((long)arg + 0x1b8);
          if (iVar1 != 0) goto code_r0x001080a1;
        }
        loop = uv_default_loop();
        local_140 = num_servers;
        iVar1 = uv_tcp_init(loop,&local_248);
        if (iVar1 != 0) {
          pcVar9 = "0 == uv_tcp_init(loop, (uv_tcp_t*) &ctx.server_handle)";
          uVar5 = 0xd6;
          goto LAB_00108493;
        }
        iVar1 = uv_tcp_bind(&local_248,(sockaddr *)&listen_addr,0);
        if (iVar1 != 0) {
          pcVar9 = 
          "0 == uv_tcp_bind((uv_tcp_t*) &ctx.server_handle, (const struct sockaddr*) &listen_addr, 0)"
          ;
          uVar5 = 0xd9;
          goto LAB_00108493;
        }
        iVar1 = uv_pipe_init(loop,&local_138,0);
        if (iVar1 != 0) {
          pcVar9 = "0 == uv_pipe_init(loop, &ctx.ipc_pipe, 0)";
          uVar5 = 0xe2;
          goto LAB_00108493;
        }
        iVar1 = uv_pipe_bind(&local_138,"/tmp/uv-test-sock");
        if (iVar1 != 0) {
          pcVar9 = "0 == uv_pipe_bind(&ctx.ipc_pipe, IPC_PIPE_NAME)";
          uVar5 = 0xe3;
          goto LAB_00108493;
        }
        iVar1 = uv_listen((uv_stream_t *)&local_138,0x80,ipc_connection_cb);
        if (iVar1 != 0) {
          pcVar9 = "0 == uv_listen((uv_stream_t*) &ctx.ipc_pipe, 128, ipc_connection_cb)";
          uVar5 = 0xe4;
          goto LAB_00108493;
        }
        puVar10 = (uv_sem_t *)((long)__ptr + 0x198);
        uVar7 = __nmemb;
        while (bVar11 = uVar7 != 0, uVar7 = uVar7 - 1, bVar11) {
          uv_sem_post(puVar10);
          puVar10 = (uv_sem_t *)((long)puVar10 + 0x1b8);
        }
        iVar1 = uv_run(loop,UV_RUN_DEFAULT);
        if (iVar1 == 0) {
          uv_close((uv_handle_t *)&local_248,(uv_close_cb)0x0);
          iVar1 = uv_run(loop,UV_RUN_DEFAULT);
          if (iVar1 == 0) {
            puVar10 = (uv_sem_t *)((long)__ptr + 0x198);
            uVar7 = __nmemb;
            while (bVar11 = uVar7 != 0, uVar7 = uVar7 - 1, bVar11) {
              uv_sem_wait(puVar10);
              puVar10 = (uv_sem_t *)((long)puVar10 + 0x1b8);
            }
            lVar6 = 0x29;
            tcp = __ptr_00;
            while (lVar6 = lVar6 + -1, lVar6 != 0) {
              tcp[1].type = 0x186a;
              tcp->data = "client handle";
              iVar1 = uv_tcp_init(puVar2,tcp);
              if (iVar1 != 0) {
                pcVar9 = "0 == uv_tcp_init(loop, handle)";
                uVar5 = 0x18b;
                goto LAB_00108493;
              }
              iVar1 = uv_tcp_connect((uv_connect_t *)&tcp[1].close_cb,tcp,(sockaddr *)&listen_addr,
                                     cl_connect_cb);
              if (iVar1 != 0) {
                pcVar9 = 
                "0 == uv_tcp_connect(&ctx->connect_req, handle, (const struct sockaddr*) &listen_addr, cl_connect_cb)"
                ;
                uVar5 = 399;
                goto LAB_00108493;
              }
              iVar1 = uv_idle_init(puVar2,(uv_idle_t *)&tcp[1].connect_req);
              tcp = (uv_tcp_t *)&tcp[1].queued_fds;
              if (iVar1 != 0) {
                pcVar9 = "0 == uv_idle_init(loop, &ctx->idle_handle)";
                uVar5 = 400;
                goto LAB_00108493;
              }
            }
            uVar3 = uv_hrtime();
            iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
            if (iVar1 == 0) {
              uVar4 = uv_hrtime();
              lVar6 = uVar4 - uVar3;
              auVar12._8_4_ = (int)((ulong)lVar6 >> 0x20);
              auVar12._0_8_ = lVar6;
              auVar12._12_4_ = 0x45300000;
              dVar13 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                       1000000000.0;
              puVar10 = (uv_sem_t *)((long)__ptr + 0x198);
              uVar7 = __nmemb;
              while (bVar11 = uVar7 != 0, uVar7 = uVar7 - 1, bVar11) {
                uv_async_send((uv_async_t *)((long)puVar10 + -0x88));
                iVar1 = uv_thread_join((uv_thread_t *)((long)puVar10 + -8));
                if (iVar1 != 0) {
                  pcVar9 = "0 == uv_thread_join(&ctx->thread_id)";
                  uVar5 = 0x19d;
                  goto LAB_00108493;
                }
                uv_sem_destroy(puVar10);
                puVar10 = (uv_sem_t *)((long)puVar10 + 0x1b8);
              }
              printf("accept%u: %.0f accepts/sec (%u total)\n",250000.0 / dVar13,(ulong)num_servers,
                     250000);
              puVar8 = (uint *)((long)__ptr + 0x108);
              for (uVar7 = 0; __nmemb != uVar7; uVar7 = uVar7 + 1) {
                printf("  thread #%u: %.0f accepts/sec (%u total, %.1f%%)\n",
                       (double)*puVar8 / dVar13,((double)*puVar8 * 100.0) / 250000.0,
                       uVar7 & 0xffffffff);
                puVar8 = puVar8 + 0x6e;
              }
              free(__ptr_00);
              free(__ptr);
              puVar2 = uv_default_loop();
              uv_walk(puVar2,close_walk_cb,(void *)0x0);
              uv_run(puVar2,UV_RUN_DEFAULT);
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              if (iVar1 == 0) {
                uv_library_shutdown();
                return extraout_EAX;
              }
              pcVar9 = "0 == uv_loop_close(uv_default_loop())";
              uVar5 = 0x1b2;
            }
            else {
              pcVar9 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
              uVar5 = 0x195;
            }
          }
          else {
            pcVar9 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
            uVar5 = 0xeb;
          }
        }
        else {
          pcVar9 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
          uVar5 = 0xe9;
        }
        goto LAB_00108493;
      }
      pcVar9 = "clients";
      uVar5 = 0x178;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
            ,uVar5,pcVar9,"!=","NULL",0,"!=",0);
    abort();
  }
  pcVar9 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &listen_addr)";
  uVar5 = 0x172;
  goto LAB_00108493;
code_r0x001080a1:
  pcVar9 = "0 == uv_thread_create(&ctx->thread_id, server_cb, ctx)";
  uVar5 = 0x181;
LAB_00108493:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
          ,uVar5,pcVar9);
  abort();
}

Assistant:

static int test_tcp(unsigned int num_servers, unsigned int num_clients) {
  struct server_ctx* servers;
  struct client_ctx* clients;
  uv_loop_t* loop;
  uv_tcp_t* handle;
  unsigned int i;
  double time;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &listen_addr));
  loop = uv_default_loop();

  servers = calloc(num_servers, sizeof(servers[0]));
  clients = calloc(num_clients, sizeof(clients[0]));
  ASSERT_NOT_NULL(servers);
  ASSERT_NOT_NULL(clients);

  /* We're making the assumption here that from the perspective of the
   * OS scheduler, threads are functionally equivalent to and interchangeable
   * with full-blown processes.
   */
  for (i = 0; i < num_servers; i++) {
    struct server_ctx* ctx = servers + i;
    ASSERT(0 == uv_sem_init(&ctx->semaphore, 0));
    ASSERT(0 == uv_thread_create(&ctx->thread_id, server_cb, ctx));
  }

  send_listen_handles(UV_TCP, num_servers, servers);

  for (i = 0; i < num_clients; i++) {
    struct client_ctx* ctx = clients + i;
    ctx->num_connects = NUM_CONNECTS / num_clients;
    handle = (uv_tcp_t*) &ctx->client_handle;
    handle->data = "client handle";
    ASSERT(0 == uv_tcp_init(loop, handle));
    ASSERT(0 == uv_tcp_connect(&ctx->connect_req,
                               handle,
                               (const struct sockaddr*) &listen_addr,
                               cl_connect_cb));
    ASSERT(0 == uv_idle_init(loop, &ctx->idle_handle));
  }

  {
    uint64_t t = uv_hrtime();
    ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
    t = uv_hrtime() - t;
    time = t / 1e9;
  }

  for (i = 0; i < num_servers; i++) {
    struct server_ctx* ctx = servers + i;
    uv_async_send(&ctx->async_handle);
    ASSERT(0 == uv_thread_join(&ctx->thread_id));
    uv_sem_destroy(&ctx->semaphore);
  }

  printf("accept%u: %.0f accepts/sec (%u total)\n",
         num_servers,
         NUM_CONNECTS / time,
         NUM_CONNECTS);

  for (i = 0; i < num_servers; i++) {
    struct server_ctx* ctx = servers + i;
    printf("  thread #%u: %.0f accepts/sec (%u total, %.1f%%)\n",
           i,
           ctx->num_connects / time,
           ctx->num_connects,
           ctx->num_connects * 100.0 / NUM_CONNECTS);
  }

  free(clients);
  free(servers);

  MAKE_VALGRIND_HAPPY();
  return 0;
}